

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

TValue * luaH_getstr(Table *t,TString *key)

{
  Node *pNVar1;
  TValue *pTVar2;
  long lVar3;
  TValue ko;
  Value local_10;
  uint local_8;
  
  if (key->tt == 4) {
    pNVar1 = t->node + (~(-1 << (t->lsizenode & 0x1f)) & key->hash);
    do {
      if (((pNVar1->i_key).nk.tt_ == 0x44) && ((TString *)(pNVar1->i_key).nk.value_.gc == key)) {
        return &pNVar1->i_val;
      }
      lVar3 = (long)(pNVar1->i_key).nk.next;
      pNVar1 = pNVar1 + lVar3;
    } while (lVar3 != 0);
    pTVar2 = &luaO_nilobject_;
  }
  else {
    local_8 = key->tt | 0x40;
    local_10 = (Value)key;
    pTVar2 = getgeneric(t,(TValue *)&local_10);
  }
  return pTVar2;
}

Assistant:

const TValue *luaH_getstr (Table *t, TString *key) {
  if (key->tt == LUA_TSHRSTR)
    return luaH_getshortstr(t, key);
  else {  /* for long strings, use generic case */
    TValue ko;
    setsvalue(cast(lua_State *, NULL), &ko, key);
    return getgeneric(t, &ko);
  }
}